

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams::InternalSwap
          (PoolingLayerParams *this,PoolingLayerParams *other)

{
  PoolingLayerParams *other_local;
  PoolingLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->kernelsize_,&other->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->stride_,&other->stride_);
  google::protobuf::internal::memswap<6>((char *)&this->type_,(char *)&other->type_);
  std::swap<CoreML::Specification::PoolingLayerParams::PoolingPaddingTypeUnion>
            (&this->PoolingPaddingType_,&other->PoolingPaddingType_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  return;
}

Assistant:

void PoolingLayerParams::InternalSwap(PoolingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(PoolingLayerParams, globalpooling_)
      + sizeof(PoolingLayerParams::globalpooling_)
      - PROTOBUF_FIELD_OFFSET(PoolingLayerParams, type_)>(
          reinterpret_cast<char*>(&type_),
          reinterpret_cast<char*>(&other->type_));
  swap(PoolingPaddingType_, other->PoolingPaddingType_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}